

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerManager.cpp
# Opt level: O2

size_t __thiscall ServerManager::syncCommands(ServerManager *this)

{
  pointer puVar1;
  unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_> *server;
  pointer puVar2;
  
  puVar1 = (this->m_servers).
           super__Vector_base<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->m_servers).
                super__Vector_base<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    IRC_Bot::setCommandAccessLevels
              ((puVar2->_M_t).super___uniq_ptr_impl<IRC_Bot,_std::default_delete<IRC_Bot>_>._M_t.
               super__Tuple_impl<0UL,_IRC_Bot_*,_std::default_delete<IRC_Bot>_>.
               super__Head_base<0UL,_IRC_Bot_*,_false>._M_head_impl,(IRCCommand *)0x0);
  }
  return (long)(this->m_servers).
               super__Vector_base<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->m_servers).
               super__Vector_base<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
}

Assistant:

size_t ServerManager::syncCommands() {
	for (const auto& server : m_servers) {
		server->setCommandAccessLevels();
	}

	return m_servers.size();
}